

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights_test.cpp
# Opt level: O0

void __thiscall GoniometricLight_Sampling_Test::TestBody(GoniometricLight_Sampling_Test *this)

{
  Point2i res;
  int iVar1;
  SampledWavelengths lambda;
  GoniometricLight light;
  Image image;
  Image *in_stack_fffffffffffff8f8;
  GoniometricLight *in_stack_fffffffffffff900;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffff908;
  Image *in_stack_fffffffffffff928;
  undefined8 uVar2;
  Float lambda_max;
  allocator<char> *in_stack_fffffffffffff930;
  Image *this_00;
  char *in_stack_fffffffffffff938;
  Image *pIVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff940;
  GoniometricLight *local_680;
  Image *in_stack_fffffffffffff9d8;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffff9e0;
  ImageChannelDesc *in_stack_fffffffffffff9f8;
  Image *in_stack_fffffffffffffa00;
  Allocator in_stack_fffffffffffffa08;
  RGBColorSpace *in_stack_fffffffffffffab8;
  Image *in_stack_fffffffffffffac0;
  int in_stack_fffffffffffffac8;
  Float in_stack_fffffffffffffacc;
  SpectrumHandle *in_stack_fffffffffffffad0;
  MediumInterface *in_stack_fffffffffffffad8;
  Transform *in_stack_fffffffffffffae0;
  GoniometricLight *in_stack_fffffffffffffae8;
  Allocator in_stack_fffffffffffffaf0;
  SampledWavelengths *in_stack_fffffffffffffbb8;
  LightHandle *in_stack_fffffffffffffbc0;
  allocator<char> local_2b9;
  undefined1 *local_2b8;
  undefined1 local_2b0 [688];
  
  pbrt::Point2<int>::Point2
            ((Point2<int> *)in_stack_fffffffffffff900,
             (int)((ulong)in_stack_fffffffffffff8f8 >> 0x20),(int)in_stack_fffffffffffff8f8);
  res.super_Tuple2<pbrt::Point2,_int>.y = (int)in_stack_fffffffffffffacc;
  res.super_Tuple2<pbrt::Point2,_int>.x = in_stack_fffffffffffffac8;
  MakeLightImage(res);
  local_2b8 = local_2b0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff940,in_stack_fffffffffffff938,in_stack_fffffffffffff930);
  local_2b0._32_8_ = local_2b0;
  local_2b0._40_8_ = 1;
  pstd::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::span((span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)in_stack_fffffffffffff900,in_stack_fffffffffffff908);
  pbrt::Image::GetChannelDesc(in_stack_fffffffffffff9d8,in_stack_fffffffffffff9e0);
  pstd::pmr::polymorphic_allocator<std::byte>::polymorphic_allocator
            ((polymorphic_allocator<std::byte> *)in_stack_fffffffffffff900);
  pbrt::Image::SelectChannels
            (in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8,in_stack_fffffffffffffa08);
  pbrt::Image::operator=((Image *)in_stack_fffffffffffff900,in_stack_fffffffffffff8f8);
  pbrt::Image::~Image((Image *)in_stack_fffffffffffff900);
  pbrt::ImageChannelDesc::~ImageChannelDesc((ImageChannelDesc *)0x51e1a1);
  pIVar3 = (Image *)local_2b0;
  this_00 = (Image *)(local_2b0 + 0x20);
  do {
    this_00 = (Image *)&this_00[-1].p32;
    std::__cxx11::string::~string((string *)this_00);
  } while (this_00 != pIVar3);
  std::allocator<char>::~allocator(&local_2b9);
  if (TestBody()::I == '\0') {
    iVar1 = __cxa_guard_acquire(&TestBody()::I);
    if (iVar1 != 0) {
      pbrt::ConstantSpectrum::ConstantSpectrum(&TestBody::I,10.0);
      __cxa_guard_release(&TestBody()::I);
    }
  }
  if (TestBody()::id == '\0') {
    iVar1 = __cxa_guard_acquire(&TestBody()::id);
    if (iVar1 != 0) {
      pbrt::Transform::Transform((Transform *)in_stack_fffffffffffff900);
      __cxa_guard_release(&TestBody()::id);
    }
  }
  pbrt::MediumInterface::MediumInterface((MediumInterface *)in_stack_fffffffffffff900);
  pbrt::SpectrumHandle::TaggedPointer<pbrt::ConstantSpectrum>
            ((SpectrumHandle *)in_stack_fffffffffffff900,
             (ConstantSpectrum *)in_stack_fffffffffffff8f8);
  pbrt::Image::Image(this_00,in_stack_fffffffffffff928);
  uVar2 = pbrt::RGBColorSpace::sRGB;
  pstd::pmr::polymorphic_allocator<std::byte>::polymorphic_allocator
            ((polymorphic_allocator<std::byte> *)in_stack_fffffffffffff900);
  lambda_max = (Float)((ulong)uVar2 >> 0x20);
  pbrt::GoniometricLight::GoniometricLight
            (in_stack_fffffffffffffae8,in_stack_fffffffffffffae0,in_stack_fffffffffffffad8,
             in_stack_fffffffffffffad0,in_stack_fffffffffffffacc,in_stack_fffffffffffffac0,
             in_stack_fffffffffffffab8,in_stack_fffffffffffffaf0);
  pbrt::Image::~Image((Image *)in_stack_fffffffffffff900);
  pbrt::SampledWavelengths::SampleUniform
            ((Float)((ulong)this_00 >> 0x20),SUB84(this_00,0),lambda_max);
  pbrt::LightHandle::TaggedPointer<pbrt::GoniometricLight>
            ((LightHandle *)in_stack_fffffffffffff900,local_680);
  testPhiVsSampled(in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
  pbrt::GoniometricLight::~GoniometricLight(in_stack_fffffffffffff900);
  pbrt::Image::~Image((Image *)in_stack_fffffffffffff900);
  return;
}

Assistant:

TEST(GoniometricLight, Sampling) {
    Image image = MakeLightImage({512, 256});
    image = image.SelectChannels(image.GetChannelDesc({"R"}));

    static ConstantSpectrum I(10.);
    static Transform id;
    GoniometricLight light(id, MediumInterface(), &I, 1.f, std::move(image),
                           RGBColorSpace::sRGB, Allocator());
    SampledWavelengths lambda = SampledWavelengths::SampleUniform(0.5);
    testPhiVsSampled(LightHandle(&light), lambda);
}